

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::Build(cmake *this,string *dir,string *target,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,bool clean)

{
  cmState *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  cmGlobalGenerator *pcVar5;
  ostream *poVar6;
  allocator local_ea;
  allocator local_e9;
  cmGlobalGenerator *local_e8;
  string output;
  string local_c0;
  string cachePath;
  string projName;
  string local_50;
  
  std::__cxx11::string::string((string *)&cachePath,"",(allocator *)&output);
  SetHomeDirectory(this,&cachePath);
  std::__cxx11::string::~string((string *)&cachePath);
  std::__cxx11::string::string((string *)&cachePath,"",(allocator *)&output);
  SetHomeOutputDirectory(this,&cachePath);
  std::__cxx11::string::~string((string *)&cachePath);
  bVar2 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar6 = std::operator<<(poVar6,(string *)dir);
    std::operator<<(poVar6," is not a directory\n");
    return 1;
  }
  FindCacheFile(&cachePath,dir);
  bVar2 = LoadCache(this,&cachePath);
  if (bVar2) {
    pcVar1 = this->State;
    std::__cxx11::string::string((string *)&output,"CMAKE_GENERATOR",(allocator *)&projName);
    pcVar4 = cmState::GetCacheEntryValue(pcVar1,&output);
    std::__cxx11::string::~string((string *)&output);
    if (pcVar4 == (char *)0x0) {
      std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
    }
    else {
      std::__cxx11::string::string((string *)&output,pcVar4,(allocator *)&projName);
      pcVar5 = CreateGlobalGenerator(this,&output);
      std::__cxx11::string::~string((string *)&output);
      if (pcVar5 != (cmGlobalGenerator *)0x0) {
        output._M_dataplus._M_p = (pointer)&output.field_2;
        output._M_string_length = 0;
        projName._M_dataplus._M_p = (pointer)&projName.field_2;
        projName._M_string_length = 0;
        output.field_2._M_local_buf[0] = '\0';
        projName.field_2._M_local_buf[0] = '\0';
        pcVar1 = this->State;
        local_e8 = pcVar5;
        std::__cxx11::string::string
                  ((string *)&local_c0,"CMAKE_PROJECT_NAME",(allocator *)&local_50);
        pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        if (pcVar4 == (char *)0x0) {
          std::operator<<((ostream *)&std::cerr,
                          "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
          iVar3 = 1;
        }
        else {
          std::__cxx11::string::assign((char *)&projName);
          pcVar1 = this->State;
          std::__cxx11::string::string
                    ((string *)&local_c0,"CMAKE_VERBOSE_MAKEFILE",(allocator *)&local_50);
          pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          if (pcVar4 == (char *)0x0) {
            bVar2 = false;
          }
          else {
            bVar2 = cmSystemTools::IsOn(pcVar4);
          }
          std::__cxx11::string::string((string *)&local_c0,"",&local_e9);
          std::__cxx11::string::string((string *)&local_50,"",&local_ea);
          iVar3 = cmGlobalGenerator::Build
                            (local_e8,&local_c0,dir,&projName,target,&output,&local_50,config,clean,
                             false,bVar2,0.0,OUTPUT_PASSTHROUGH,nativeOptions);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        std::__cxx11::string::~string((string *)&projName);
        std::__cxx11::string::~string((string *)&output);
        (*local_e8->_vptr_cmGlobalGenerator[1])();
        goto LAB_00326323;
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"");
      poVar6 = std::operator<<(poVar6,pcVar4);
      std::operator<<(poVar6,"\"\n");
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
  }
  iVar3 = 1;
LAB_00326323:
  std::__cxx11::string::~string((string *)&cachePath);
  return iVar3;
}

Assistant:

int cmake::Build(const std::string& dir, const std::string& target,
                 const std::string& config,
                 const std::vector<std::string>& nativeOptions, bool clean)
{

  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  const char* cachedGenerator =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  CM_AUTO_PTR<cmGlobalGenerator> gen(
    this->CreateGlobalGenerator(cachedGenerator));
  if (!gen.get()) {
    std::cerr << "Error: could create CMAKE_GENERATOR \"" << cachedGenerator
              << "\"\n";
    return 1;
  }
  std::string output;
  std::string projName;
  const char* cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = cachedProjectName;
  bool verbose = false;
  const char* cachedVerbose =
    this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE");
  if (cachedVerbose) {
    verbose = cmSystemTools::IsOn(cachedVerbose);
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" +
    GetCMakeFilesDirectoryPostSlash() +
    cmGlobalVisualStudio8Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList.c_str()) &&
      !cmakeCheckStampList(stampList.c_str(), false)) {

    // Correctly initialize the home (=source) and home output (=binary)
    // directories, which is required for running the generation step.
    std::string homeOrig = this->GetHomeDirectory();
    std::string homeOutputOrig = this->GetHomeOutputDirectory();
    this->SetDirectoriesFromFile(cachePath.c_str());

    this->AddScriptingCommands();
    this->AddProjectCommands();

    int ret = this->Configure();
    if (ret) {
      cmSystemTools::Message("CMake Configure step failed.  "
                             "Build files cannot be regenerated correctly.");
      return ret;
    }
    ret = this->Generate();
    if (ret) {
      cmSystemTools::Message("CMake Generate step failed.  "
                             "Build files cannot be regenerated correctly.");
      return ret;
    }
    std::string message = "Build files have been written to: ";
    message += this->GetHomeOutputDirectory();
    this->UpdateProgress(message.c_str(), -1);

    // Restore the previously set directories to their original value.
    this->SetHomeDirectory(homeOrig);
    this->SetHomeOutputDirectory(homeOutputOrig);
  }
#endif

  return gen->Build("", dir, projName, target, output, "", config, clean,
                    false, verbose, 0, cmSystemTools::OUTPUT_PASSTHROUGH,
                    nativeOptions);
}